

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

ClassDecl * __thiscall SQCompilation::SQParser::ClassExp(SQParser *this,Expr *key)

{
  SQInteger SVar1;
  SQInteger SVar2;
  Arena *this_00;
  ClassDecl *decl;
  uint uVar3;
  Expr *pEVar4;
  long lVar5;
  Chunk *pCVar6;
  
  uVar3 = this->_depth;
  if (500 < uVar3) {
    reportDiagnostic(this,0x1d);
    uVar3 = this->_depth;
  }
  this->_depth = uVar3 + 1;
  SVar1 = (this->_lex)._tokenline;
  lVar5 = this->_token;
  SVar2 = (this->_lex)._tokencolumn;
  if (lVar5 == 0x28) {
    Lex(this);
    pEVar4 = Expression(this,SQE_RVALUE);
    Expect(this,0x29);
  }
  else {
    if (lVar5 != 0x134) {
      pEVar4 = (Expr *)0x0;
      goto LAB_00163da0;
    }
    Lex(this);
    pEVar4 = Expression(this,SQE_RVALUE);
  }
  lVar5 = this->_token;
LAB_00163da0:
  if ((lVar5 == 0x7b) && (((this->_lex)._prevflags & 1) != 0)) {
    reportDiagnostic(this,0x69);
  }
  Expect(this,0x7b);
  this_00 = this->_astArena;
  pCVar6 = Arena::findChunk(this_00,0x48);
  decl = (ClassDecl *)pCVar6->_ptr;
  pCVar6->_ptr = (uint8_t *)(decl + 1);
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._op = TO_CLASS;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineStart = -1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnStart = -1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineEnd = -1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnEnd = -1;
  (decl->super_TableDecl)._members._arena = this_00;
  (decl->super_TableDecl)._members._vals = (TableMember *)0x0;
  (decl->super_TableDecl)._members._size = 0;
  (decl->super_TableDecl)._members._allocated = 0;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a3008;
  decl->_key = key;
  decl->_base = pEVar4;
  ParseTableOrClass(this,(TableDecl *)decl,0x3b,0x7d);
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineStart = (int)SVar1;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnStart =
       (int)SVar2;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (decl->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  this->_depth = this->_depth - 1;
  return decl;
}

Assistant:

ClassDecl* SQParser::ClassExp(Expr *key)
{
    NestingChecker nc(this);
    SQInteger l = line(), c = column();
    Expr *baseExpr = NULL;
    if(_token == TK_EXTENDS) {
        Lex();
        baseExpr = Expression(SQE_RVALUE);
    }
    else if (_token == _SC('(')) {
      Lex();
      baseExpr = Expression(SQE_RVALUE);
      Expect(_SC(')'));
    }
    checkBraceIndentationStyle();
    Expect(_SC('{'));
    ClassDecl *d = newNode<ClassDecl>(arena(), key, baseExpr);
    ParseTableOrClass(d, _SC(';'),_SC('}'));
    return setCoordinates(d, l, c);
}